

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void test_all_files(void)

{
  char *__s;
  int iVar1;
  log_level_t lVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  char uncompressed [80];
  char compressed [80];
  char acStack_d8 [6];
  undefined8 auStack_d2 [9];
  char local_88 [8];
  undefined4 auStack_80 [20];
  
  log_trace("test_all_files","\n");
  lVar5 = 0;
  do {
    log_info("---------------------------------------------------------------------------------------------"
             ,"\n");
    __s = *(char **)((long)TEST_FILES + lVar5);
    pcVar3 = strrchr(__s,0x2f);
    strcpy(local_88,pcVar3 + 1);
    sVar4 = strlen(local_88);
    builtin_strncpy(local_88 + sVar4,".compres",8);
    *(undefined4 *)((long)auStack_80 + sVar4) = 0x646573;
    strcpy(acStack_d8,pcVar3 + 1);
    sVar4 = strlen(acStack_d8);
    builtin_strncpy(acStack_d8 + sVar4,".uncompr",8);
    *(undefined8 *)((long)auStack_d2 + sVar4) = 0x64657373657270;
    iVar1 = adh_compress_file(__s,local_88);
    if (iVar1 == 1) {
      return;
    }
    lVar2 = get_log_level();
    if (LOG_INFO < lVar2) {
      puts("\n\n\n\n");
    }
    log_info("---------------","\n");
    lVar2 = get_log_level();
    if (LOG_INFO < lVar2) {
      puts("\n\n\n\n");
    }
    iVar1 = adh_decompress_file(local_88,acStack_d8);
    if (iVar1 == 1) {
      return;
    }
    log_info("---------------","\n");
    iVar1 = compare_files(__s,acStack_d8);
    if (iVar1 != 0) {
      return;
    }
    bVar6 = lVar5 != 0x68;
    lVar5 = lVar5 + 8;
  } while (bVar6);
  return;
}

Assistant:

void test_all_files() {
    log_trace("test_all_files", "\n");
    char compressed[MAX_FILE_NAME];
    char uncompressed[MAX_FILE_NAME];

    for(int i=0; i<NUM_TEST_FILES; i++) {
        log_info("---------------------------------------------------------------------------------------------", "\n");
        char * filename = strrchr(TEST_FILES[i], '/') + 1;

        strcpy(compressed, filename);
        strcat(compressed, ".compressed");

        strcpy(uncompressed, filename);
        strcat(uncompressed, ".uncompressed");

        int rc = adh_compress_file(TEST_FILES[i], compressed);
        if(rc == RC_FAIL)
            break;

        if(get_log_level() > LOG_INFO) {
            puts("\n\n\n\n");
        }


        log_info("---------------", "\n");

        if(get_log_level() > LOG_INFO)
            puts("\n\n\n\n");

        rc = adh_decompress_file(compressed, uncompressed);
        if(rc == RC_FAIL)
            break;

        log_info("---------------", "\n");
        rc = compare_files(TEST_FILES[i], uncompressed);
        if(rc == RC_FAIL)
            break;
    }
}